

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_test.c
# Opt level: O0

char * test_interval_recording(void)

{
  int iVar1;
  hdr_histogram *phVar2;
  hdr_histogram *recorder_corrected_histogram;
  hdr_histogram *recorder_histogram;
  hdr_interval_recorder recorder_corrected;
  hdr_interval_recorder recorder;
  hdr_histogram *expected_corrected_histogram;
  hdr_histogram *expected_histogram;
  char *result;
  int local_18;
  int value;
  int i;
  int value_count;
  
  value = 1000000;
  hdr_interval_recorder_init_all
            ((hdr_interval_recorder *)&recorder_corrected.phaser.reader_mutex,1,86400000000,3);
  hdr_interval_recorder_init_all((hdr_interval_recorder *)&recorder_histogram,1,86400000000,3);
  hdr_init(1,86400000000,3,&expected_corrected_histogram);
  hdr_init(1,86400000000,3,(hdr_histogram **)&recorder.phaser.reader_mutex);
  for (local_18 = 0; local_18 < value; local_18 = local_18 + 1) {
    iVar1 = rand();
    result._4_4_ = iVar1 % 20000;
    hdr_record_value(expected_corrected_histogram,(long)result._4_4_);
    hdr_record_corrected_value
              ((hdr_histogram *)recorder.phaser.reader_mutex,(long)result._4_4_,1000);
    hdr_interval_recorder_record_value
              ((hdr_interval_recorder *)&recorder_corrected.phaser.reader_mutex,(long)result._4_4_);
    hdr_interval_recorder_record_corrected_value
              ((hdr_interval_recorder *)&recorder_histogram,(long)result._4_4_,1000);
  }
  phVar2 = hdr_interval_recorder_sample
                     ((hdr_interval_recorder *)&recorder_corrected.phaser.reader_mutex);
  expected_histogram = (hdr_histogram *)compare_histograms(expected_corrected_histogram,phVar2);
  _i = expected_histogram;
  if (expected_histogram == (hdr_histogram *)0x0) {
    phVar2 = hdr_interval_recorder_sample((hdr_interval_recorder *)&recorder_histogram);
    _i = (hdr_histogram *)compare_histograms((hdr_histogram *)recorder.phaser.reader_mutex,phVar2);
    if (_i == (hdr_histogram *)0x0) {
      _i = (hdr_histogram *)0x0;
    }
  }
  return (char *)_i;
}

Assistant:

static char* test_interval_recording(void)
{
    int value_count, i, value;
    char* result;
    struct hdr_histogram* expected_histogram;
    struct hdr_histogram* expected_corrected_histogram;
    struct hdr_interval_recorder recorder;
    struct hdr_interval_recorder recorder_corrected;
    struct hdr_histogram* recorder_histogram;
    struct hdr_histogram* recorder_corrected_histogram;

    value_count = 1000000;
    hdr_interval_recorder_init_all(&recorder, 1, INT64_C(24) * 60 * 60 * 1000000, 3);
    hdr_interval_recorder_init_all(&recorder_corrected, 1, INT64_C(24) * 60 * 60 * 1000000, 3);
    hdr_init(1, INT64_C(24) * 60 * 60 * 1000000, 3, &expected_histogram);
    hdr_init(1, INT64_C(24) * 60 * 60 * 1000000, 3, &expected_corrected_histogram);

    for (i = 0; i < value_count; i++)
    {
        value = rand() % 20000;
        hdr_record_value(expected_histogram, value);
        hdr_record_corrected_value(expected_corrected_histogram, value, 1000);
        hdr_interval_recorder_record_value(&recorder, value);
        hdr_interval_recorder_record_corrected_value(&recorder_corrected, value, 1000);
    }

    recorder_histogram = hdr_interval_recorder_sample(&recorder);

    result = compare_histograms(expected_histogram, recorder_histogram);
    if (result)
    {
        return result;
    }

    recorder_corrected_histogram = hdr_interval_recorder_sample(&recorder_corrected);
    result = compare_histograms(expected_corrected_histogram, recorder_corrected_histogram);
    if (result)
    {
        return result;
    }

    return 0;
}